

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

small_mempool * small_mempool_search(small_alloc *alloc,size_t size)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  small_mempool *psVar4;
  uint uVar5;
  uint uVar6;
  
  psVar4 = (small_mempool *)0x0;
  if (size <= alloc->objsize_max) {
    puVar1 = &(alloc->small_class).size_shift_plus_1;
    uVar6 = (uint)size - *puVar1;
    if ((uint)size < *puVar1) {
      uVar6 = 0;
    }
    uVar6 = uVar6 >> ((byte)(alloc->small_class).ignore_bits_count & 0x1f);
    if ((alloc->small_class).effective_size <= uVar6) {
      bVar2 = (byte)(alloc->small_class).effective_bits;
      uVar5 = uVar6 >> (bVar2 & 0x1f);
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = (iVar3 << (bVar2 & 0x1f)) + (uVar6 >> ((byte)iVar3 & 0x1f));
    }
    psVar4 = alloc->small_mempool_cache + uVar6;
  }
  return psVar4;
}

Assistant:

static inline struct small_mempool *
small_mempool_search(struct small_alloc *alloc, size_t size)
{
	if (size > alloc->objsize_max)
		return NULL;
	unsigned cls =
		small_class_calc_offset_by_size(&alloc->small_class, size);
	struct small_mempool *pool = &alloc->small_mempool_cache[cls];
	return pool;
}